

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deThreadTest.c
# Opt level: O0

void mutexTestThr2(void *arg)

{
  int iVar1;
  deBool dVar2;
  int local_1c;
  deInt32 localCounter;
  deInt32 numIncremented;
  MutexData2 *data;
  void *arg_local;
  
  local_1c = 0;
  while (deMutex_lock(*arg), *(int *)((long)arg + 8) < *(int *)((long)arg + 0x10)) {
    iVar1 = *(int *)((long)arg + 8);
    deYield();
    do {
      dVar2 = deGetFalse();
      if ((dVar2 != 0) || (iVar1 != *(int *)((long)arg + 8))) {
        deAssertFail("localCounter == data->counter",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                     ,0xd1);
      }
      dVar2 = deGetFalse();
    } while (dVar2 != 0);
    *(int *)((long)arg + 8) = iVar1 + 1;
    deMutex_unlock(*arg);
    local_1c = local_1c + 1;
  }
  deMutex_unlock(*arg);
  deMutex_lock(*arg);
  *(int *)((long)arg + 0xc) = local_1c + *(int *)((long)arg + 0xc);
  deMutex_unlock(*arg);
  return;
}

Assistant:

static void mutexTestThr2 (void* arg)
{
	MutexData2* data = (MutexData2*)arg;
	deInt32 numIncremented = 0;

	for (;;)
	{
		deInt32 localCounter;
		deMutex_lock(data->mutex);

		if (data->counter >= data->maxVal)
		{
			deMutex_unlock(data->mutex);
			break;
		}

		localCounter = data->counter;
		deYield();

		DE_TEST_ASSERT(localCounter == data->counter);
		localCounter += 1;
		data->counter = localCounter;

		deMutex_unlock(data->mutex);

		numIncremented++;
	}

	deMutex_lock(data->mutex);
	data->counter2 += numIncremented;
	deMutex_unlock(data->mutex);
}